

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall amrex::FabArrayBase::FB::define_epo(FB *this,FabArrayBase *fa)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Long LVar6;
  int *piVar7;
  reference pIVar8;
  size_type sVar9;
  reference pvVar10;
  reference pBVar11;
  byte bVar12;
  FabArrayBase *in_RSI;
  undefined1 *in_RDI;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *cctv;
  pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  *kv;
  iterator __end2;
  iterator __begin2;
  MapOfCopyComTagContainers *__range2;
  MapOfCopyComTagContainers *Tags;
  int ipass;
  const_iterator End_tile;
  const_iterator it_tile;
  BoxList tilelist;
  Box dbx;
  Box sbx;
  const_iterator lit_1;
  BoxList *bl_1;
  int src_owner;
  Box *dst_bx;
  int ksnd_1;
  int M_1;
  int j_1;
  const_iterator pit_1;
  Box result_1;
  Box *bxrcv;
  Box *vbx;
  int krcv_1;
  int i_1;
  bool check_remote;
  bool check_local;
  BoxList bl_remote;
  BoxList bl_local;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *recv_tags;
  const_iterator lit;
  BoxList *bl;
  int dst_owner;
  Box *bx;
  int krcv;
  int M;
  int j;
  const_iterator pit;
  Box bxsnd;
  int ksnd;
  int i;
  Box pdomain;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *send_tags;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pshifts;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  IndexType *typ;
  IntVect *ng;
  int nlocal;
  Vector<int,_std::allocator<int>_> *imap;
  DistributionMapping *dm;
  BoxArray *ba;
  int MyProc;
  int off;
  uint bitval;
  uint typ_1;
  int dir;
  BoxArray *in_stack_fffffffffffff798;
  BoxArray *in_stack_fffffffffffff7a0;
  __normal_iterator<amrex::FabArrayBase::CopyComTag_*,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  in_stack_fffffffffffff7a8;
  __normal_iterator<amrex::FabArrayBase::CopyComTag_*,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  in_stack_fffffffffffff7b0;
  Box *in_stack_fffffffffffff7c0;
  undefined7 in_stack_fffffffffffff7c8;
  undefined1 in_stack_fffffffffffff7cf;
  mapped_type *in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  Periodicity *in_stack_fffffffffffff7f8;
  IntVect *tilesize;
  Box *bx_00;
  BoxArray *this_00;
  _Self local_6f0;
  _Self local_6e8;
  BoxArray *local_6e0;
  BoxArray *local_6d8;
  int local_6cc;
  undefined8 in_stack_fffffffffffff940;
  Box local_660 [3];
  CopyComTag local_5f4;
  Box local_5b4;
  CopyComTag local_598;
  Box *local_558;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_550 [5];
  Box local_528;
  Box local_50c;
  Box *local_4f0;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_4e8;
  undefined1 local_4e0 [32];
  undefined1 *local_4c0;
  int local_4b8;
  IntVect local_4b4 [2];
  IntVect *local_498;
  int local_490;
  int local_48c;
  int local_488;
  int local_468 [2];
  int local_460;
  int local_454;
  int iStack_450;
  int local_44c;
  IntVect *local_448;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_440;
  Box local_434;
  Box *local_418;
  undefined1 local_40c [28];
  undefined1 *local_3f0;
  int local_3e8;
  int local_3e4;
  byte local_3de;
  byte local_3dd;
  uint local_3dc;
  uint local_3b4;
  type local_390;
  Box local_384;
  CopyComTag local_368;
  Box *local_328;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_320;
  undefined1 local_318 [32];
  undefined1 *local_2f8;
  int local_2ec;
  Box *local_2e8;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2b8 [2];
  int local_2b0;
  int local_2a4;
  int iStack_2a0;
  int local_29c;
  IntVect *local_298;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_290;
  undefined1 local_288 [24];
  uint local_270;
  int local_25c;
  int in_stack_fffffffffffffda8;
  IndexType in_stack_fffffffffffffdac;
  int iVar13;
  uint uVar14;
  int in_stack_fffffffffffffdbc;
  Box *in_stack_fffffffffffffdc0;
  BoxArray *in_stack_fffffffffffffdc8;
  IndexType local_22c [7];
  undefined1 local_210 [24];
  undefined1 *local_1f8;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_1f0;
  uint local_1d4;
  uint *local_1d0;
  IntVect *local_1c8;
  int local_1bc;
  Vector<int,_std::allocator<int>_> *local_1b8;
  DistributionMapping *local_1b0;
  BoxArray *local_1a8;
  int local_19c;
  FabArrayBase *local_198;
  IntVect *local_188;
  undefined1 *local_180;
  IntVect *local_178;
  undefined1 *local_170;
  int local_168;
  uint local_164;
  uint local_160;
  int local_15c;
  undefined1 *local_158;
  uint local_14c;
  int *local_148;
  reference local_140;
  undefined4 local_134;
  int *local_130;
  undefined4 local_124;
  int *local_120;
  undefined4 local_114;
  int *local_110;
  int *local_108;
  reference local_100;
  undefined4 local_f4;
  int *local_f0;
  undefined4 local_e4;
  int *local_e0;
  undefined4 local_d4;
  int *local_d0;
  int local_c8 [2];
  int local_c0;
  IntVect local_b4;
  int local_a8 [2];
  int local_a0;
  IntVect local_98;
  int local_8c;
  IndexType *local_88;
  int local_7c;
  uint *local_78;
  int local_6c;
  uint *local_68;
  int local_5c;
  IndexType *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined1 *local_40;
  uint local_38;
  int local_34;
  IndexType *local_30;
  int local_24;
  IndexType *local_20;
  int local_18;
  int local_14;
  IndexType *local_10;
  int local_4;
  
  local_198 = in_RSI;
  local_19c = ParallelDescriptor::MyProc();
  local_1a8 = boxArray(local_198);
  local_1b0 = DistributionMap(local_198);
  local_1b8 = IndexArray(local_198);
  LVar6 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x10038af);
  local_1bc = (int)LVar6;
  local_1c8 = (IntVect *)(in_RDI + 0x30);
  local_1d4 = (uint)BoxArray::ixType(in_stack_fffffffffffff798);
  local_1d0 = &local_1d4;
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             0x10038fe);
  Periodicity::shiftIntVect(in_stack_fffffffffffff7f8);
  local_1f8 = local_210;
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               *)in_stack_fffffffffffff7a0);
  Periodicity::Domain((Periodicity *)in_stack_fffffffffffff7c0);
  uVar14 = *local_1d0;
  local_158 = &stack0xfffffffffffffdbc;
  for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
    local_78 = &local_14c;
    local_7c = local_15c;
    local_6c = local_15c;
    local_4c = local_15c;
    bVar12 = (byte)local_15c;
    local_160 = (uint)((uVar14 & 1 << (bVar12 & 0x1f)) != 0);
    local_88 = local_22c;
    local_8c = local_15c;
    local_5c = local_15c;
    local_50 = local_15c;
    local_164 = (uint)((local_22c[0].itype & 1 << (bVar12 & 0x1f)) != 0);
    local_168 = local_160 - local_164;
    local_40 = &stack0xfffffffffffffdc8;
    local_44 = local_15c;
    *(int *)(local_40 + (long)local_15c * 4) = local_168 + *(int *)(local_40 + (long)local_15c * 4);
    local_30 = local_22c;
    local_34 = local_15c;
    if (local_160 == 0) {
      local_24 = local_15c;
      local_18 = local_15c;
      local_22c[0].itype = (1 << (bVar12 & 0x1f) ^ 0xffffffffU) & local_22c[0].itype;
      local_20 = local_30;
    }
    else {
      local_14 = local_15c;
      local_4 = local_15c;
      local_22c[0].itype = 1 << (bVar12 & 0x1f) | local_22c[0].itype;
      local_10 = local_30;
    }
    local_68 = local_78;
    local_58 = local_88;
    local_48 = local_168;
    local_38 = local_160;
  }
  local_14c = uVar14;
  for (iVar13 = 0; iVar13 < local_1bc; iVar13 = iVar13 + 1) {
    piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7a0,
                        (size_type)in_stack_fffffffffffff798);
    iVar4 = *piVar7;
    BoxArray::operator[]
              ((BoxArray *)in_stack_fffffffffffff7b0._M_current,
               (int)((ulong)in_stack_fffffffffffff7a8._M_current >> 0x20));
    local_170 = local_288;
    local_178 = local_1c8;
    local_25c = (int)local_288._16_8_;
    in_stack_fffffffffffffda8 = SUB84(local_288._16_8_,4);
    in_stack_fffffffffffffdac.itype = local_270;
    Box::grow((Box *)&stack0xfffffffffffffd94,local_1c8);
    Box::operator&=((Box *)&stack0xfffffffffffffd94,(Box *)&stack0xfffffffffffffdbc);
    bVar2 = Box::ok((Box *)&stack0xfffffffffffffd94);
    if (bVar2) {
      local_290._M_current =
           (IntVect *)
           std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::cbegin
                     ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                      in_stack_fffffffffffff798);
      while( true ) {
        local_298 = (IntVect *)
                    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::cend
                              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               in_stack_fffffffffffff798);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                            *)in_stack_fffffffffffff7a0,
                           (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                            *)in_stack_fffffffffffff798);
        if (!bVar2) break;
        pIVar8 = __gnu_cxx::
                 __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                 ::operator*(&local_290);
        IntVect::IntVect(&local_98,0);
        local_a0 = local_98.vect[2];
        local_a8[0] = local_98.vect[0];
        local_a8[1] = local_98.vect[1];
        local_2b0 = local_98.vect[2];
        local_2b8[0] = local_98.vect[0];
        local_2b8[1] = local_98.vect[1];
        local_2a4 = local_98.vect[0];
        iStack_2a0 = local_98.vect[1];
        uVar1 = _local_2a4;
        local_29c = local_98.vect[2];
        local_108 = &local_2a4;
        local_d4 = 0;
        local_2a4 = local_98.vect[0];
        bVar2 = true;
        if (pIVar8->vect[0] == local_2a4) {
          local_e4 = 1;
          iStack_2a0 = local_98.vect[1];
          bVar2 = true;
          local_e0 = local_108;
          if (pIVar8->vect[1] == iStack_2a0) {
            local_f4 = 2;
            bVar2 = pIVar8->vect[2] != local_98.vect[2];
            local_f0 = local_108;
          }
        }
        _local_2a4 = uVar1;
        local_100 = pIVar8;
        local_d0 = local_108;
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
          ::operator*(&local_290);
          Box::operator+((Box *)in_stack_fffffffffffff7a0,(IntVect *)in_stack_fffffffffffff798);
          BoxArray::intersections
                    (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      *)CONCAT44(in_stack_fffffffffffffdbc,uVar14),SUB41((uint)iVar13 >> 0x18,0),
                     (IntVect *)CONCAT44(in_stack_fffffffffffffdac.itype,in_stack_fffffffffffffda8))
          ;
          local_2d8 = 0;
          sVar9 = std::
                  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                  size(&local_1f0);
          local_2dc = (int)sVar9;
          for (; local_2d8 < local_2dc; local_2d8 = local_2d8 + 1) {
            pvVar10 = std::
                      vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ::operator[](&local_1f0,(long)local_2d8);
            local_2e0 = pvVar10->first;
            pvVar10 = std::
                      vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ::operator[](&local_1f0,(long)local_2d8);
            local_2e8 = &pvVar10->second;
            local_2ec = DistributionMapping::operator[]
                                  ((DistributionMapping *)in_stack_fffffffffffff7a0,
                                   (int)((ulong)in_stack_fffffffffffff798 >> 0x20));
            bVar2 = ParallelDescriptor::sameTeam(0);
            iVar5 = local_19c;
            if ((!bVar2) &&
               (iVar3 = DistributionMapping::operator[]
                                  ((DistributionMapping *)in_stack_fffffffffffff7a0,
                                   (int)((ulong)in_stack_fffffffffffff798 >> 0x20)), iVar5 == iVar3)
               ) {
              boxDiff((Box *)CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8),
                      in_stack_fffffffffffff7c0);
              local_2f8 = local_318;
              local_320._M_current = (Box *)BoxList::begin((BoxList *)in_stack_fffffffffffff798);
              while( true ) {
                local_328 = (Box *)BoxList::end((BoxList *)in_stack_fffffffffffff798);
                bVar2 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                    *)in_stack_fffffffffffff7a0,
                                   (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                    *)in_stack_fffffffffffff798);
                if (!bVar2) break;
                std::
                map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                             (key_type *)in_stack_fffffffffffff7d8);
                pBVar11 = __gnu_cxx::
                          __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                          ::operator*(&local_320);
                __gnu_cxx::
                __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                ::operator*(&local_320);
                __gnu_cxx::
                __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                ::operator*(&local_290);
                Box::operator-((Box *)in_stack_fffffffffffff7a0,(IntVect *)in_stack_fffffffffffff798
                              );
                CopyComTag::CopyComTag(&local_368,pBVar11,&local_384,local_2e0,iVar4);
                std::
                vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                             *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
                __gnu_cxx::
                __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                ::operator++(&local_320);
              }
              BoxList::~BoxList((BoxList *)0x10041b6);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
        ::operator++(&local_290);
      }
    }
  }
  local_390 = std::
              unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                           *)in_stack_fffffffffffff7a0);
  local_3b4 = (uint)BoxArray::ixType(in_stack_fffffffffffff798);
  BoxList::BoxList((BoxList *)in_stack_fffffffffffff798,
                   (IndexType)(uint)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
  local_3dc = (uint)BoxArray::ixType(in_stack_fffffffffffff798);
  BoxList::BoxList((BoxList *)in_stack_fffffffffffff798,
                   (IndexType)(uint)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
  local_3dd = 0;
  local_3de = 0;
  iVar4 = ParallelDescriptor::TeamSize();
  if (1 < iVar4) {
    local_3dd = 1;
  }
  for (local_3e4 = 0; local_3e4 < local_1bc; local_3e4 = local_3e4 + 1) {
    piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7a0,
                        (size_type)in_stack_fffffffffffff798);
    local_3e8 = *piVar7;
    BoxArray::operator[]
              ((BoxArray *)in_stack_fffffffffffff7b0._M_current,
               (int)((ulong)in_stack_fffffffffffff7a8._M_current >> 0x20));
    local_3f0 = local_40c;
    local_188 = local_1c8;
    local_180 = local_3f0;
    Box::grow(&local_434,local_1c8);
    local_418 = &local_434;
    bVar2 = Box::contains((Box *)&stack0xfffffffffffffdbc,local_418);
    if (!bVar2) {
      local_440._M_current =
           (IntVect *)
           std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                     ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                      in_stack_fffffffffffff798);
      while( true ) {
        local_448 = (IntVect *)
                    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               in_stack_fffffffffffff798);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                            *)in_stack_fffffffffffff7a0,
                           (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                            *)in_stack_fffffffffffff798);
        if (!bVar2) break;
        pIVar8 = __gnu_cxx::
                 __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                 ::operator*(&local_440);
        IntVect::IntVect(&local_b4,0);
        local_c0 = local_b4.vect[2];
        local_c8[0] = local_b4.vect[0];
        local_c8[1] = local_b4.vect[1];
        local_460 = local_b4.vect[2];
        local_468[0] = local_b4.vect[0];
        local_468[1] = local_b4.vect[1];
        local_454 = local_b4.vect[0];
        iStack_450 = local_b4.vect[1];
        uVar1 = _local_454;
        local_44c = local_b4.vect[2];
        local_148 = &local_454;
        local_114 = 0;
        local_454 = local_b4.vect[0];
        bVar2 = true;
        if (pIVar8->vect[0] == local_454) {
          local_124 = 1;
          iStack_450 = local_b4.vect[1];
          bVar2 = true;
          local_120 = local_148;
          if (pIVar8->vect[1] == iStack_450) {
            local_134 = 2;
            bVar2 = pIVar8->vect[2] != local_b4.vect[2];
            local_130 = local_148;
          }
        }
        _local_454 = uVar1;
        local_140 = pIVar8;
        local_110 = local_148;
        if (bVar2) {
          bx_00 = local_418;
          this_00 = local_1a8;
          __gnu_cxx::
          __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
          ::operator*(&local_440);
          Box::operator+((Box *)in_stack_fffffffffffff7a0,(IntVect *)in_stack_fffffffffffff798);
          BoxArray::intersections
                    (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                     (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      *)CONCAT44(in_stack_fffffffffffffdbc,uVar14),SUB41((uint)iVar13 >> 0x18,0),
                     (IntVect *)CONCAT44(in_stack_fffffffffffffdac.itype,in_stack_fffffffffffffda8))
          ;
          local_488 = 0;
          sVar9 = std::
                  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                  size(&local_1f0);
          local_48c = (int)sVar9;
          for (; local_488 < local_48c; local_488 = local_488 + 1) {
            pvVar10 = std::
                      vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ::operator[](&local_1f0,(long)local_488);
            local_490 = pvVar10->first;
            std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
            operator[](&local_1f0,(long)local_488);
            __gnu_cxx::
            __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
            ::operator*(&local_440);
            tilesize = local_4b4;
            Box::operator-((Box *)in_stack_fffffffffffff7a0,(IntVect *)in_stack_fffffffffffff798);
            local_498 = tilesize;
            local_4b8 = DistributionMapping::operator[]
                                  ((DistributionMapping *)in_stack_fffffffffffff7a0,
                                   (int)((ulong)in_stack_fffffffffffff798 >> 0x20));
            boxDiff((Box *)CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8),
                    in_stack_fffffffffffff7c0);
            local_4c0 = local_4e0;
            local_4e8._M_current = (Box *)BoxList::begin((BoxList *)in_stack_fffffffffffff798);
            while( true ) {
              local_4f0 = (Box *)BoxList::end((BoxList *)in_stack_fffffffffffff798);
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                  *)in_stack_fffffffffffff7a0,
                                 (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                  *)in_stack_fffffffffffff798);
              if (!bVar2) break;
              __gnu_cxx::
              __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
              ::operator*(&local_4e8);
              __gnu_cxx::
              __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
              ::operator*(&local_440);
              Box::operator+((Box *)in_stack_fffffffffffff7a0,(IntVect *)in_stack_fffffffffffff798);
              Box::operator&=(&local_50c,(Box *)&stack0xfffffffffffffdbc);
              bVar2 = Box::ok(&local_50c);
              if (bVar2) {
                __gnu_cxx::
                __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                ::operator*(&local_440);
                Box::operator-((Box *)in_stack_fffffffffffff7a0,(IntVect *)in_stack_fffffffffffff798
                              );
                bVar2 = ParallelDescriptor::sameTeam(0);
                if (bVar2) {
                  BoxList::BoxList((BoxList *)this_00,bx_00,tilesize);
                  local_550[0]._M_current =
                       (Box *)BoxList::begin((BoxList *)in_stack_fffffffffffff798);
                  local_558 = (Box *)BoxList::end((BoxList *)in_stack_fffffffffffff798);
                  while (bVar2 = __gnu_cxx::operator!=
                                           ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                             *)in_stack_fffffffffffff7a0,
                                            (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                             *)in_stack_fffffffffffff798), bVar2) {
                    std::
                    unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                    ::operator->((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                                  *)0x100485e);
                    pBVar11 = __gnu_cxx::
                              __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                              ::operator*(local_550);
                    __gnu_cxx::
                    __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    ::operator*(local_550);
                    __gnu_cxx::
                    __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                    ::operator*(&local_440);
                    Box::operator+((Box *)in_stack_fffffffffffff7a0,
                                   (IntVect *)in_stack_fffffffffffff798);
                    CopyComTag::CopyComTag(&local_598,pBVar11,&local_5b4,local_3e8,local_490);
                    std::
                    vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                    ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                 *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798
                               );
                    __gnu_cxx::
                    __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    ::operator++(local_550);
                  }
                  if ((local_3dd & 1) != 0) {
                    BoxList::push_back((BoxList *)in_stack_fffffffffffff7a0,
                                       (Box *)in_stack_fffffffffffff798);
                  }
                  BoxList::~BoxList((BoxList *)0x1004988);
                }
                else {
                  iVar4 = local_19c;
                  iVar5 = DistributionMapping::operator[]
                                    ((DistributionMapping *)in_stack_fffffffffffff7a0,
                                     (int)((ulong)in_stack_fffffffffffff798 >> 0x20));
                  if (iVar4 == iVar5) {
                    in_stack_fffffffffffff7d8 =
                         std::
                         map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                         ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                                       *)CONCAT44(iVar4,in_stack_fffffffffffff7e0),
                                      (key_type *)in_stack_fffffffffffff7d8);
                    CopyComTag::CopyComTag(&local_5f4,&local_528,&local_50c,local_3e8,local_490);
                    std::
                    vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                    ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                 *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798
                               );
                    if ((local_3de & 1) != 0) {
                      BoxList::push_back((BoxList *)in_stack_fffffffffffff7a0,
                                         (Box *)in_stack_fffffffffffff798);
                    }
                  }
                }
              }
              __gnu_cxx::
              __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
              ::operator++(&local_4e8);
            }
            BoxList::~BoxList((BoxList *)0x1004a62);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
        ::operator++(&local_440);
      }
      LVar6 = BoxList::size((BoxList *)0x1004aad);
      if (LVar6 < 2) {
        *in_RDI = 1;
      }
      else {
        in_stack_fffffffffffff7c0 = local_660;
        BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff7b0._M_current,
                           (BoxList *)in_stack_fffffffffffff7a8._M_current);
        in_stack_fffffffffffff7cf = BoxArray::isDisjoint((BoxArray *)in_stack_fffffffffffff940);
        *in_RDI = in_stack_fffffffffffff7cf;
        BoxArray::~BoxArray(in_stack_fffffffffffff7a0);
      }
      LVar6 = BoxList::size((BoxList *)0x1004b3d);
      if (LVar6 < 2) {
        in_RDI[1] = 1;
      }
      else {
        in_stack_fffffffffffff7b0._M_current = (CopyComTag *)&stack0xfffffffffffff938;
        BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff7b0._M_current,
                           (BoxList *)in_stack_fffffffffffff7a8._M_current);
        bVar2 = BoxArray::isDisjoint((BoxArray *)in_stack_fffffffffffff940);
        in_RDI[1] = bVar2;
        BoxArray::~BoxArray(in_stack_fffffffffffff7a0);
      }
    }
  }
  for (local_6cc = 0; local_6cc < 2; local_6cc = local_6cc + 1) {
    if (local_6cc == 0) {
      in_stack_fffffffffffff7a8._M_current =
           (CopyComTag *)
           std::
           unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                        *)in_stack_fffffffffffff7a0);
      in_stack_fffffffffffff7a0 = (BoxArray *)in_stack_fffffffffffff7a8._M_current;
    }
    else {
      in_stack_fffffffffffff798 =
           (BoxArray *)
           std::
           unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                        *)in_stack_fffffffffffff7a0);
      in_stack_fffffffffffff7a0 = in_stack_fffffffffffff798;
    }
    local_6e0 = in_stack_fffffffffffff7a0;
    local_6d8 = in_stack_fffffffffffff7a0;
    local_6e8._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
         ::begin((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                  *)in_stack_fffffffffffff798);
    local_6f0._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
         ::end((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                *)in_stack_fffffffffffff798);
    while (bVar2 = std::operator!=(&local_6e8,&local_6f0), bVar2) {
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                   *)0x1004cb2);
      std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
      ::begin((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
               *)in_stack_fffffffffffff798);
      std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
      ::end((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
             *)in_stack_fffffffffffff798);
      std::
      sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>>
                (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                    *)in_stack_fffffffffffff7a0);
    }
  }
  BoxList::~BoxList((BoxList *)0x1004d48);
  BoxList::~BoxList((BoxList *)0x1004d55);
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~vector
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
             in_stack_fffffffffffff7b0._M_current);
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             in_stack_fffffffffffff7b0._M_current);
  return;
}

Assistant:

void
FabArrayBase::FB::define_epo (const FabArrayBase& fa)
{
    const int                  MyProc   = ParallelDescriptor::MyProc();
    const BoxArray&            ba       = fa.boxArray();
    const DistributionMapping& dm       = fa.DistributionMap();
    const Vector<int>&         imap     = fa.IndexArray();

    // For local copy, all workers in the same team will have the identical copy of tags
    // so that they can share work.  But for remote communication, they are all different.

    const int nlocal = imap.size();
    const IntVect& ng = m_ngrow;
    const IndexType& typ = ba.ixType();
    std::vector< std::pair<int,Box> > isects;

    const std::vector<IntVect>& pshifts = m_period.shiftIntVect();

    auto& send_tags = *m_SndTags;

    Box pdomain = m_period.Domain();
    pdomain.convert(typ);

    for (int i = 0; i < nlocal; ++i)
    {
        const int ksnd = imap[i];
        Box bxsnd = amrex::grow(ba[ksnd],ng);
        bxsnd &= pdomain; // source must be inside the periodic domain.

        if (!bxsnd.ok()) continue;

        for (auto pit=pshifts.cbegin(); pit!=pshifts.cend(); ++pit)
        {
            if (*pit != IntVect::TheZeroVector())
            {
                ba.intersections(bxsnd+(*pit), isects, false, ng);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int krcv      = isects[j].first;
                    const Box& bx       = isects[j].second;
                    const int dst_owner = dm[krcv];

                    if (ParallelDescriptor::sameTeam(dst_owner)) {
                        continue;  // local copy will be dealt with later
                    } else if (MyProc == dm[ksnd]) {
                        const BoxList& bl = amrex::boxDiff(bx, pdomain);
                        for (BoxList::const_iterator lit = bl.begin(); lit != bl.end(); ++lit) {
                            send_tags[dst_owner].push_back(CopyComTag(*lit, (*lit)-(*pit), krcv, ksnd));
                        }
                    }
                }
            }
        }
    }

    auto& recv_tags = *m_RcvTags;

    BoxList bl_local(ba.ixType());
    BoxList bl_remote(ba.ixType());

    bool check_local = false, check_remote = false;
#if defined(AMREX_USE_GPU)
    check_local = true;
    check_remote = true;
#elif defined(AMREX_USE_OMP)
    if (omp_get_max_threads() > 1) {
        check_local = true;
        check_remote = true;
    }
#endif

    if (ParallelDescriptor::TeamSize() > 1) {
        check_local = true;
    }

    for (int i = 0; i < nlocal; ++i)
    {
        const int   krcv = imap[i];
        const Box& vbx   = ba[krcv];
        const Box& bxrcv = amrex::grow(vbx, ng);

        if (pdomain.contains(bxrcv)) continue;

        for (std::vector<IntVect>::const_iterator pit=pshifts.begin(); pit!=pshifts.end(); ++pit)
        {
            if (*pit != IntVect::TheZeroVector())
            {
                ba.intersections(bxrcv+(*pit), isects, false, ng);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int ksnd      = isects[j].first;
                    const Box& dst_bx   = isects[j].second - *pit;
                    const int src_owner = dm[ksnd];

                    const BoxList& bl = amrex::boxDiff(dst_bx, pdomain);

                    for (BoxList::const_iterator lit = bl.begin(); lit != bl.end(); ++lit)
                    {
                        Box sbx = (*lit) + (*pit);
                        sbx &= pdomain; // source must be inside the periodic domain.

                        if (sbx.ok()) {
                            Box dbx = sbx - (*pit);
                            if (ParallelDescriptor::sameTeam(src_owner)) { // local copy
                                const BoxList tilelist(dbx, FabArrayBase::comm_tile_size);
                                for (BoxList::const_iterator
                                         it_tile  = tilelist.begin(),
                                         End_tile = tilelist.end();   it_tile != End_tile; ++it_tile)
                                {
                                    m_LocTags->push_back(CopyComTag(*it_tile, (*it_tile)+(*pit), krcv, ksnd));
                                }
                                if (check_local) {
                                    bl_local.push_back(dbx);
                                }
                            } else if (MyProc == dm[krcv]) {
                                recv_tags[src_owner].push_back(CopyComTag(dbx, sbx, krcv, ksnd));
                                if (check_remote) {
                                    bl_remote.push_back(dbx);
                                }
                            }
                        }
                    }
                }
            }
        }

        if (bl_local.size() <= 1) {
            m_threadsafe_loc = true;
        } else {
            m_threadsafe_loc = BoxArray(std::move(bl_local)).isDisjoint();
        }

        if (bl_remote.size() <= 1) {
            m_threadsafe_rcv = true;
        } else {
            m_threadsafe_rcv = BoxArray(std::move(bl_remote)).isDisjoint();
        }
    }

    for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
    {
        CopyComTag::MapOfCopyComTagContainers & Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
        for (auto& kv : Tags)
        {
            std::vector<CopyComTag>& cctv = kv.second;
            // We need to fix the order so that the send and recv processes match.
            std::sort(cctv.begin(), cctv.end());
        }
    }
}